

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O1

Result __thiscall
wabt::interp::anon_unknown_0::BinaryReaderInterp::OnImportMemory
          (BinaryReaderInterp *this,Index import_index,string_view module_name,
          string_view field_name,Index memory_index,Limits *page_limits)

{
  ModuleDesc *pMVar1;
  Result RVar2;
  Enum EVar3;
  pointer *__ptr;
  undefined1 local_108 [8];
  value_type local_100;
  string_view local_d8;
  string_view local_c8;
  undefined1 *local_b8 [2];
  undefined1 local_a8 [16];
  undefined1 *local_98 [2];
  undefined1 local_88 [16];
  _func_int **local_78;
  string local_70;
  string local_50;
  
  local_d8.size_ = field_name.size_;
  local_d8.data_ = field_name.data_;
  local_c8.size_ = module_name.size_;
  local_c8.data_ = module_name.data_;
  RVar2 = SharedValidator::OnMemory
                    (&this->validator_,(Location *)(anonymous_namespace)::BinaryReaderInterp::loc,
                     page_limits);
  EVar3 = Error;
  if (RVar2.enum_ != Error) {
    local_100.limits.initial = page_limits->initial;
    local_100.limits.max = page_limits->max;
    local_100.limits.has_max = page_limits->has_max;
    local_100.super_ExternType.kind = Memory;
    local_100.super_ExternType._vptr_ExternType = (_func_int **)&PTR__ExternType_001ea930;
    local_100.limits.is_shared = page_limits->is_shared;
    local_100.limits._18_3_ = *(undefined3 *)&page_limits->field_0x12;
    local_100.limits._21_3_ = SUB43((uint)*(undefined4 *)&page_limits->field_0x14 >> 8,0);
    if ((local_100.limits.has_max & 1U) == 0) {
      local_100.limits.max = 0x10000;
    }
    pMVar1 = this->module_;
    string_view::to_string_abi_cxx11_(&local_50,&local_c8);
    string_view::to_string_abi_cxx11_(&local_70,&local_d8);
    MemoryType::Clone((MemoryType *)local_108);
    local_b8[0] = local_a8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_b8,local_50._M_dataplus._M_p,
               local_50._M_dataplus._M_p + local_50._M_string_length);
    local_98[0] = local_88;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_98,local_70._M_dataplus._M_p,
               local_70._M_dataplus._M_p + local_70._M_string_length);
    local_78 = (_func_int **)local_108;
    local_108 = (undefined1  [8])0x0;
    std::vector<wabt::interp::ImportDesc,_std::allocator<wabt::interp::ImportDesc>_>::
    emplace_back<wabt::interp::ImportDesc>(&pMVar1->imports,(ImportDesc *)local_b8);
    if (local_78 != (_func_int **)0x0) {
      (**(code **)(*local_78 + 8))();
    }
    local_78 = (_func_int **)0x0;
    if (local_98[0] != local_88) {
      operator_delete(local_98[0]);
    }
    if (local_b8[0] != local_a8) {
      operator_delete(local_b8[0]);
    }
    if (local_108 != (undefined1  [8])0x0) {
      (**(code **)(*(_func_int **)local_108 + 8))();
    }
    local_108 = (undefined1  [8])0x0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    std::vector<wabt::interp::MemoryType,_std::allocator<wabt::interp::MemoryType>_>::push_back
              (&this->memory_types_,&local_100);
    EVar3 = Ok;
  }
  return (Result)EVar3;
}

Assistant:

Result BinaryReaderInterp::OnImportMemory(Index import_index,
                                          string_view module_name,
                                          string_view field_name,
                                          Index memory_index,
                                          const Limits* page_limits) {
  CHECK_RESULT(validator_.OnMemory(loc, *page_limits));
  MemoryType memory_type{*page_limits};
  module_.imports.push_back(ImportDesc{ImportType(
      module_name.to_string(), field_name.to_string(), memory_type.Clone())});
  memory_types_.push_back(memory_type);
  return Result::Ok;
}